

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O0

void __thiscall OpenMD::LJ::calcForce(LJ *this,InteractionData *idat)

{
  double dVar1;
  reference pvVar2;
  reference this_00;
  double *pdVar3;
  int *in_RSI;
  LJ *in_RDI;
  Vector<double,_3U> *pVVar4;
  RealType dudr;
  RealType pot_temp;
  RealType myDerivC;
  RealType myDeriv;
  RealType myPotC;
  RealType myPot;
  RealType rcos;
  RealType ros;
  RealType epsilon;
  RealType sigmai;
  LJInteractionData *mixer;
  LJ *in_stack_00000130;
  Vector<double,_3U> *in_stack_ffffffffffffff28;
  Vector<double,_3U> *in_stack_ffffffffffffff30;
  Vector<double,_3U> *in_stack_ffffffffffffff38;
  RealType local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  double local_38;
  double local_30;
  RealType local_28;
  double local_20;
  reference local_18;
  int *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->initialized_ & 1U) == 0) {
    initialize(in_stack_00000130);
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->LJtids,(long)*local_10);
  this_00 = std::
            vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
            ::operator[](&in_RDI->MixingMap,(long)*pvVar2);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->LJtids,(long)local_10[1]);
  local_18 = std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::
             operator[](this_00,(long)*pvVar2);
  local_20 = local_18->sigmai;
  local_28 = local_18->epsilon;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  local_30 = *(double *)(local_10 + 8) * local_20;
  getLJfunc(in_RDI,local_30,&local_40,&local_50);
  if ((*(byte *)(local_10 + 0xe) & 1) == 0) {
    if ((*(byte *)((long)local_10 + 0x39) & 1) == 0) {
      local_48 = 0.0;
      local_58 = 0.0;
    }
    else {
      local_38 = *(double *)(local_10 + 0xc) * local_20;
      getLJfunc(in_RDI,local_38,&local_48,&local_58);
      local_48 = local_58 * (*(double *)(local_10 + 8) - *(double *)(local_10 + 0xc)) * local_20 +
                 local_48;
    }
  }
  else {
    local_38 = *(double *)(local_10 + 0xc) * local_20;
    getLJfunc(in_RDI,local_38,&local_48,&local_58);
    local_58 = 0.0;
  }
  pVVar4 = (Vector<double,_3U> *)(*(double *)(local_10 + 0x14) * local_28 * (local_40 - local_48));
  *(double *)(local_10 + 0x34) = (double)pVVar4 + *(double *)(local_10 + 0x34);
  dVar1 = *(double *)(local_10 + 0x10);
  pdVar3 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x18),1);
  *pdVar3 = dVar1 * (double)pVVar4 + *pdVar3;
  if ((*(byte *)((long)local_10 + 0xdb) & 1) != 0) {
    in_stack_ffffffffffffff30 = *(Vector<double,_3U> **)(local_10 + 0x10);
    pdVar3 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x38),1);
    *pdVar3 = (double)in_stack_ffffffffffffff30 * (double)pVVar4 + *pdVar3;
    in_stack_ffffffffffffff38 = pVVar4;
  }
  OpenMD::operator*(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
  operator/(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
  Vector<double,_3U>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  return;
}

Assistant:

void LJ::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    LJInteractionData& mixer =
        MixingMap[LJtids[idat.atid1]][LJtids[idat.atid2]];

    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getLJfunc(ros, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getLJfunc(rcos, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getLJfunc(rcos, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr =
        idat.sw * idat.vdwMult * epsilon * (myDeriv - myDerivC) * sigmai;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }